

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void hide_tractor_beam_command_proc(Am_Object *command_obj)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Object local_38;
  Am_Object local_30;
  byte local_25;
  bool vis;
  Am_Object local_18;
  Am_Object beam;
  Am_Object *command_obj_local;
  
  beam.data = (Am_Object_Data *)command_obj;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)command_obj,0x169);
  Am_Object::Am_Object(&local_18,pAVar2);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) != 0) {
    pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x69);
    local_25 = Am_Value::operator_cast_to_bool(pAVar2);
    Am_Object::Set((ushort)&local_18,true,(ulong)((byte)~local_25 & 1));
    if ((local_25 & 1) == 0) {
      Am_Object::Am_Object(&local_30,(Am_Object *)&local_18);
      add_tractor_beam_to_both_ships(&local_30);
      Am_Object::~Am_Object(&local_30);
    }
    else {
      Am_Object::Am_Object(&local_38,(Am_Object *)&local_18);
      remove_tractor_beam_from_both_ships(&local_38);
      Am_Object::~Am_Object(&local_38);
    }
    Am_Object::Set((ushort)command_obj,true,(ulong)(local_25 & 1));
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, hide_tractor_beam_command,
                 (Am_Object command_obj))
{
  Am_Object beam = (Am_Object)(command_obj.Get(Am_VALUE));
  if (beam.Valid()) {
    bool vis = beam.Get(Am_VISIBLE);
    beam.Set(Am_VISIBLE, !vis);
    if (!vis)
      add_tractor_beam_to_both_ships(beam);
    else
      remove_tractor_beam_from_both_ships(beam);
    command_obj.Set(Am_HAS_BEEN_UNDONE, vis); // opposite of visible
  }
}